

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O1

void searchCluster(Mat *binary,mPoint *point,
                  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *cluster)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Rb_tree_color _Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> neighbors;
  mPoint local_d0;
  mPoint local_c8;
  _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>
  local_c0;
  Mat local_90 [96];
  
  std::_Rb_tree<mPoint,mPoint,std::_Identity<mPoint>,std::less<mPoint>,std::allocator<mPoint>>::
  _M_insert_unique<mPoint_const&>
            ((_Rb_tree<mPoint,mPoint,std::_Identity<mPoint>,std::less<mPoint>,std::allocator<mPoint>>
              *)cluster,point);
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar2 = (point->super_Point).x;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < iVar2) {
    local_d0.super_Point.x = iVar2 + -1;
    local_d0.super_Point.y = (point->super_Point).y;
    std::
    _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>::
    _M_insert_unique<mPoint>(&local_c0,&local_d0);
  }
  iVar2 = (point->super_Point).y;
  if (0 < iVar2) {
    local_d0.super_Point.x = (point->super_Point).x;
    local_d0.super_Point.y = iVar2 + -1;
    std::
    _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>::
    _M_insert_unique<mPoint>(&local_c0,&local_d0);
  }
  iVar2 = (point->super_Point).x;
  if (iVar2 < *(int *)(binary + 0xc) + -1) {
    local_d0.super_Point.x = iVar2 + 1;
    local_d0.super_Point.y = (point->super_Point).y;
    std::
    _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>::
    _M_insert_unique<mPoint>(&local_c0,&local_d0);
  }
  iVar2 = (point->super_Point).y;
  if (iVar2 < *(int *)(binary + 8) + -1) {
    local_d0.super_Point.x = (point->super_Point).x;
    local_d0.super_Point.y = iVar2 + 1;
    std::
    _Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>::
    _M_insert_unique<mPoint>(&local_c0,&local_d0);
  }
  if ((_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_c0._M_impl.super__Rb_tree_header) {
    p_Var1 = &(cluster->_M_t)._M_impl.super__Rb_tree_header;
    p_Var5 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      _Var3 = p_Var5[1]._M_color;
      iVar2 = *(int *)&p_Var5[1].field_0x4;
      for (p_Var4 = (cluster->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          ((_Rb_tree_header *)p_Var4 != p_Var1 &&
          ((p_Var4[1]._M_color != _Var3 || (*(int *)&p_Var4[1].field_0x4 != iVar2))));
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      }
      if (((_Rb_tree_header *)p_Var4 == p_Var1) &&
         (*(char *)((long)(int)_Var3 +
                   (long)iVar2 * **(long **)(binary + 0x48) + *(long *)(binary + 0x10)) == -1)) {
        cv::Mat::Mat(local_90,binary);
        local_c8.super_Point.x = _Var3;
        local_c8.super_Point.y = iVar2;
        searchCluster(local_90,&local_c8,cluster);
        cv::Mat::~Mat(local_90);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_c0._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<mPoint,_mPoint,_std::_Identity<mPoint>,_std::less<mPoint>,_std::allocator<mPoint>_>
  ::~_Rb_tree(&local_c0);
  return;
}

Assistant:

void searchCluster(cv::Mat binary, mPoint point, std::set<mPoint>& cluster) {
	cluster.insert(point);

	std::set<mPoint> neighbors;
	if (point.x >= 1)
		neighbors.insert(mPoint(point.x - 1, point.y));
	if (point.y >= 1)
		neighbors.insert(mPoint(point.x, point.y - 1));
	if (point.x < binary.cols - 1)
		neighbors.insert(mPoint(point.x + 1, point.y));
	if (point.y < binary.rows - 1)
		neighbors.insert(mPoint(point.x, point.y + 1));

	for (auto neighbor : neighbors) {
		if (std::find(cluster.begin(), cluster.end(), neighbor) == cluster.end()) {
			if (binary.at<uchar>(neighbor) == UCHAR_MAX) {
				searchCluster(binary, neighbor, cluster);
			}
		}
	}
}